

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O3

int nn_respondent_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  
  if (((ulong)self[0x1b].vfptr & 1) != 0) goto LAB_0015306d;
  while( true ) {
    iVar1 = nn_xrespondent_recv(self,msg);
    if (iVar1 == 0) {
      nn_chunkref_mv((nn_chunkref *)&self[0x1b].sock,&msg->sphdr);
      nn_chunkref_init(&msg->sphdr,0);
      *(byte *)&self[0x1b].vfptr = *(byte *)&self[0x1b].vfptr | 1;
      return 0;
    }
    if (iVar1 == -0xb) break;
    nn_respondent_recv_cold_1();
LAB_0015306d:
    nn_chunkref_term((nn_chunkref *)&self[0x1b].sock);
    *(byte *)&self[0x1b].vfptr = *(byte *)&self[0x1b].vfptr & 0xfe;
  }
  return -0xb;
}

Assistant:

static int nn_respondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    /*  Cancel current survey and clean up backtrace, if it exists. */
    if (nn_slow (respondent->flags & NN_RESPONDENT_INPROGRESS)) {
        nn_chunkref_term (&respondent->backtrace);
        respondent->flags &= ~NN_RESPONDENT_INPROGRESS;
    }

    /*  Get next survey. */
    rc = nn_xrespondent_recv (&respondent->xrespondent.sockbase, msg);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc == 0, -rc);

    /*  Store the backtrace. */
    nn_chunkref_mv (&respondent->backtrace, &msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 0);

    /*  Remember that survey is being processed. */
    respondent->flags |= NN_RESPONDENT_INPROGRESS;

    return 0;
}